

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

If_DsdMan_t * If_DsdManLoad(char *pFileName)

{
  int iVar1;
  Vec_Mem_t *p;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  FILE *__stream;
  If_DsdMan_t *p_00;
  size_t sVar4;
  void *pvVar5;
  void **ppvVar6;
  int *piVar7;
  uint *puVar8;
  uint *puVar9;
  word *pwVar10;
  Vec_Wrd_t *pVVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  int Num;
  int Num2;
  char pBuffer [10];
  uint local_68;
  int local_64;
  If_DsdMan_t *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  int local_3a [2];
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar16 = "Reading DSD manager file \"%s\" has failed.\n";
LAB_00422f15:
    printf(pcVar16,pFileName);
    return (If_DsdMan_t *)0x0;
  }
  fread(local_3a,4,1,__stream);
  if (local_3a[0] != 0x31647364) {
    pcVar16 = "Unrecognized format of file \"%s\".\n";
    goto LAB_00422f15;
  }
  fread(&local_68,4,1,__stream);
  p_00 = If_DsdManAlloc(local_68,0);
  if (p_00->pStore != (char *)0x0) {
    free(p_00->pStore);
  }
  if (pFileName == (char *)0x0) {
    pcVar16 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar16 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar16,pFileName);
  }
  p_00->pStore = pcVar16;
  fread(&local_68,4,1,__stream);
  p_00->LutSize = local_68;
  pvVar5 = If_ManSatBuildXY(local_68);
  p_00->pSat = pvVar5;
  fread(&local_68,4,1,__stream);
  uVar12 = local_68;
  lVar18 = (long)(int)local_68;
  if (lVar18 < 2) {
    __assert_fail("Num >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x46f,"If_DsdMan_t *If_DsdManLoad(char *)");
  }
  iVar15 = (p_00->vObjs).nSize;
  local_60 = p_00;
  if (iVar15 < (int)local_68) {
    iVar1 = (p_00->vObjs).nCap;
    uVar3 = iVar1 * 2;
    if ((int)uVar3 < (int)local_68) {
      ppvVar6 = (p_00->vObjs).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc(lVar18 * 8);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,lVar18 * 8);
      }
      (p_00->vObjs).pArray = ppvVar6;
      uVar3 = uVar12;
LAB_00423054:
      (p_00->vObjs).nCap = uVar3;
    }
    else {
      ppvVar6 = (p_00->vObjs).pArray;
      if (iVar1 < (int)local_68) {
        if (ppvVar6 == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar3 << 3);
        }
        else {
          ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar3 << 3);
        }
        (local_60->vObjs).pArray = ppvVar6;
        p_00 = local_60;
        goto LAB_00423054;
      }
    }
    memset(ppvVar6 + iVar15,0,(lVar18 - iVar15) * 8);
    (p_00->vObjs).nSize = uVar12;
  }
  piVar7 = (p_00->vNexts).pArray;
  if ((p_00->vNexts).nCap < (int)uVar12) {
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(lVar18 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,lVar18 << 2);
    }
    (p_00->vNexts).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_004236a6;
    (p_00->vNexts).nCap = uVar12;
  }
  sVar4 = lVar18 << 2;
  memset(piVar7,0,sVar4);
  (p_00->vNexts).nSize = uVar12;
  piVar7 = (p_00->vTruths).pArray;
  if ((p_00->vTruths).nCap < (int)uVar12) {
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc(sVar4);
    }
    else {
      piVar7 = (int *)realloc(piVar7,sVar4);
    }
    (p_00->vTruths).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_004236a6:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vTruths).nCap = uVar12;
  }
  memset(piVar7,0xff,sVar4);
  (p_00->vTruths).nSize = uVar12;
  uVar12 = uVar12 * 2 - 1;
  while( true ) {
    do {
      uVar13 = uVar12 + 1;
      uVar3 = uVar12 & 1;
      uVar12 = uVar13;
    } while (uVar3 != 0);
    if (uVar13 < 9) break;
    iVar15 = 5;
    while (uVar13 % (iVar15 - 2U) != 0) {
      uVar3 = iVar15 * iVar15;
      iVar15 = iVar15 + 2;
      if (uVar13 < uVar3) goto LAB_00423142;
    }
  }
LAB_00423142:
  p_00->nBins = uVar13;
  sVar4 = (long)(int)uVar13 << 2;
  if (p_00->pBins == (uint *)0x0) {
    puVar8 = (uint *)malloc(sVar4);
  }
  else {
    puVar8 = (uint *)realloc(p_00->pBins,sVar4);
  }
  p_00->pBins = puVar8;
  memset(puVar8,0,sVar4);
  iVar15 = (p_00->vObjs).nSize;
  if (2 < iVar15) {
    lVar18 = 2;
    do {
      fread(&local_68,4,1,__stream);
      lVar17 = (long)(int)local_68;
      puVar8 = (uint *)Mem_FlexEntryFetch(p_00->pMem,local_68 * 8);
      fread(puVar8,lVar17 << 3,1,__stream);
      (p_00->vObjs).pArray[lVar18] = puVar8;
      uVar12 = puVar8[1];
      if ((uVar12 & 7) == 6) {
        fread(&local_68,4,1,__stream);
        if ((p_00->vTruths).nSize <= lVar18) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p_00->vTruths).pArray[lVar18] = local_68;
        uVar12 = puVar8[1];
      }
      iVar15 = -1;
      if (0x17ffffff < uVar12 && (uVar12 & 7) == 6) {
        uVar3 = *puVar8;
        if (((long)(int)uVar3 < 0) || ((p_00->vTruths).nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar15 = (p_00->vTruths).pArray[(int)uVar3];
      }
      puVar9 = If_DsdObjHashLookup(p_00,uVar12 & 7,(int *)(puVar8 + 2),uVar12 >> 0x1b,iVar15);
      if (*puVar9 != 0) {
        __assert_fail("*pSpot == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x482,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      *puVar9 = *puVar8;
      lVar18 = lVar18 + 1;
      iVar15 = (p_00->vObjs).nSize;
    } while (lVar18 < iVar15);
  }
  if (p_00->nUniqueMisses != iVar15 + -2) {
    __assert_fail("p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x485,"If_DsdMan_t *If_DsdManLoad(char *)");
  }
  p_00->nUniqueMisses = 0;
  pwVar10 = (word *)malloc((long)p_00->nWords << 3);
  local_50 = (ulong)(uint)p_00->nVars;
  if (2 < p_00->nVars) {
    local_50 = local_50 + 1;
    uVar14 = 3;
    do {
      p = p_00->vTtMem[uVar14];
      iVar15 = p->nEntrySize;
      local_48 = uVar14;
      fread(&local_68,4,1,__stream);
      uVar12 = local_68;
      if (0 < (int)local_68) {
        uVar3 = local_68;
        do {
          fread(pwVar10,(long)(iVar15 << 3),1,__stream);
          Vec_MemHashInsert(p,pwVar10);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (uVar12 != p->nEntries) {
        __assert_fail("Num == Vec_MemEntryNum(p->vTtMem[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x491,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      fread(&local_54,4,1,__stream);
      local_64 = local_54;
      iVar15 = local_54;
      if (0 < local_54) {
        do {
          fread(&local_68,4,1,__stream);
          uVar12 = local_68;
          puVar8 = (uint *)malloc(0x10);
          uVar3 = uVar12;
          if (uVar12 - 1 < 0xf) {
            uVar3 = 0x10;
          }
          puVar8[1] = 0;
          *puVar8 = uVar3;
          if (uVar3 == 0) {
            pvVar5 = (void *)0x0;
          }
          else {
            pvVar5 = malloc((long)(int)uVar3 << 2);
          }
          *(void **)(puVar8 + 2) = pvVar5;
          fread(pvVar5,(long)(int)uVar12 << 2,1,__stream);
          puVar8[1] = uVar12;
          pVVar2 = local_60->vTtDecs[local_48];
          uVar12 = pVVar2->nSize;
          if (uVar12 == pVVar2->nCap) {
            if ((int)uVar12 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar6;
              pVVar2->nCap = 0x10;
            }
            else {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar12 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar12 << 4);
              }
              pVVar2->pArray = ppvVar6;
              pVVar2->nCap = uVar12 * 2;
            }
          }
          else {
            ppvVar6 = pVVar2->pArray;
          }
          iVar1 = pVVar2->nSize;
          pVVar2->nSize = iVar1 + 1;
          ppvVar6[iVar1] = puVar8;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      if (local_64 != local_60->vTtDecs[local_48]->nSize) {
        __assert_fail("Num2 == Vec_PtrSize(p->vTtDecs[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x49b,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      uVar14 = local_48 + 1;
      p_00 = local_60;
    } while (uVar14 != local_50);
  }
  if (pwVar10 != (word *)0x0) {
    free(pwVar10);
  }
  fread(&local_68,4,1,__stream);
  p_00->nConfigWords = local_68;
  fread(&local_68,4,1,__stream);
  p_00->nTtBits = local_68;
  sVar4 = fread(&local_68,4,1,__stream);
  uVar12 = local_68;
  if (local_68 != 0 && (int)sVar4 != 0) {
    lVar18 = (long)(int)local_68;
    pVVar11 = (Vec_Wrd_t *)malloc(0x10);
    uVar3 = 0x10;
    if (0x10 < uVar12) {
      uVar3 = uVar12;
    }
    pVVar11->nCap = uVar3;
    pwVar10 = (word *)malloc((long)(int)uVar3 << 3);
    pVVar11->pArray = pwVar10;
    pVVar11->nSize = uVar12;
    memset(pwVar10,0,lVar18 << 3);
    p_00->vConfigs = pVVar11;
    fread(pwVar10,lVar18 << 3,1,__stream);
  }
  sVar4 = fread(&local_68,4,1,__stream);
  if (local_68 != 0 && (int)sVar4 != 0) {
    pcVar16 = (char *)calloc((long)(int)local_68 + 1,1);
    p_00->pCellStr = pcVar16;
    fread(pcVar16,(long)(int)local_68,1,__stream);
  }
  fclose(__stream);
  return p_00;
}

Assistant:

If_DsdMan_t * If_DsdManLoad( char * pFileName )
{
    If_DsdMan_t * p;
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    char pBuffer[10];
    unsigned * pSpot;
    word * pTruth;
    int i, v, Num, Num2, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Reading DSD manager file \"%s\" has failed.\n", pFileName );
        return NULL;
    }
    RetValue = fread( pBuffer, 4, 1, pFile );
    if ( strncmp(pBuffer, DSD_VERSION, strlen(DSD_VERSION)) )
    {
        printf( "Unrecognized format of file \"%s\".\n", pFileName );
        return NULL;
    }
    RetValue = fread( &Num, 4, 1, pFile );
    p = If_DsdManAlloc( Num, 0 );
    ABC_FREE( p->pStore );
    p->pStore = Abc_UtilStrsav( pFileName );
    RetValue = fread( &Num, 4, 1, pFile );
    p->LutSize = Num;
    p->pSat  = If_ManSatBuildXY( p->LutSize );
    RetValue = fread( &Num, 4, 1, pFile );
    assert( Num >= 2 );
    Vec_PtrFillExtra( &p->vObjs, Num, NULL );
    Vec_IntFill( &p->vNexts, Num, 0 );
    Vec_IntFill( &p->vTruths, Num, -1 );
    p->nBins = Abc_PrimeCudd( 2*Num );
    p->pBins = ABC_REALLOC( unsigned, p->pBins, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned) * p->nBins );
    for ( i = 2; i < Vec_PtrSize(&p->vObjs); i++ )
    {
        RetValue = fread( &Num, 4, 1, pFile );
        pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * Num );
        RetValue = fread( pObj, sizeof(word)*Num, 1, pFile );
        Vec_PtrWriteEntry( &p->vObjs, i, pObj );
        if ( pObj->Type == IF_DSD_PRIME )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            Vec_IntWriteEntry( &p->vTruths, i, Num );
        }
        pSpot = If_DsdObjHashLookup( p, pObj->Type, (int *)pObj->pFans, pObj->nFans, If_DsdObjTruthId(p, pObj) );
        assert( *pSpot == 0 );
        *pSpot = pObj->Id;
    }
    assert( p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2 );
    p->nUniqueMisses = 0;
    pTruth = ABC_ALLOC( word, p->nWords );
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        RetValue = fread( &Num, 4, 1, pFile );
        for ( i = 0; i < Num; i++ )
        {
            RetValue = fread( pTruth, nBytes, 1, pFile );
            Vec_MemHashInsert( p->vTtMem[v], pTruth );
        }
        assert( Num == Vec_MemEntryNum(p->vTtMem[v]) );
        RetValue = fread( &Num2, 4, 1, pFile );
        for ( i = 0; i < Num2; i++ )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            vSets = Vec_IntAlloc( Num );
            RetValue = fread( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
            vSets->nSize = Num;
            Vec_PtrPush( p->vTtDecs[v], vSets );
        }
        assert( Num2 == Vec_PtrSize(p->vTtDecs[v]) ); 
    }
    ABC_FREE( pTruth );
    RetValue = fread( &Num, 4, 1, pFile );
    p->nConfigWords = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    p->nTtBits = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->vConfigs = Vec_WrdStart( Num );
        RetValue = fread( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    }
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->pCellStr = ABC_CALLOC( char, Num + 1 );
        RetValue = fread( p->pCellStr, sizeof(char)*Num, 1, pFile );
    }
    fclose( pFile );
    return p;
}